

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O0

void commit_ll(D_Scope *st,D_SymHash *sh)

{
  D_Sym *pDVar1;
  D_Sym *sym;
  D_SymHash *sh_local;
  D_Scope *st_local;
  
  if (st->search != (D_Scope *)0x0) {
    commit_ll(st->search,sh);
    while (st->ll != (D_Sym *)0x0) {
      pDVar1 = st->ll->next;
      symhash_add(sh,st->ll);
      st->ll = pDVar1;
    }
  }
  return;
}

Assistant:

static void commit_ll(D_Scope *st, D_SymHash *sh) {
  D_Sym *sym;
  if (st->search) {
    commit_ll(st->search, sh);
    for (; st->ll; st->ll = sym) {
      sym = st->ll->next;
      symhash_add(sh, st->ll);
    }
  }
}